

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::
       createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedType<unsigned_char> min,WrappedType<unsigned_char> max)

{
  deUint32 dVar1;
  int iVar2;
  char *pcVar3;
  WrappedType<unsigned_char> WVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  deRandom rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  if (stride == 0) {
    stride = componentCount;
  }
  iVar5 = stride * 6;
  iVar2 = 0;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  pcVar3 = (char *)operator_new__((long)(iVar5 * count));
  if (0 < count) {
    uVar6 = 0;
    do {
      if (0 < componentCount) {
        lVar8 = (long)iVar2;
        uVar7 = 0;
        do {
          WVar4.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_40);
            WVar4.m_value = (char)(dVar1 % ((uint)max.m_value - (uint)min.m_value)) + min.m_value;
          }
          pcVar3[uVar7 + lVar8] = WVar4.m_value;
          pcVar3[uVar7 + lVar8 + stride] = WVar4.m_value;
          pcVar3[uVar7 + lVar8 + stride * 2] = WVar4.m_value;
          pcVar3[uVar7 + lVar8 + stride * 3] = WVar4.m_value;
          pcVar3[uVar7 + lVar8 + (stride << 2)] = WVar4.m_value;
          pcVar3[uVar7 + lVar8 + stride * 5] = WVar4.m_value;
          uVar7 = uVar7 + 1;
        } while ((uint)componentCount != uVar7);
      }
      uVar6 = uVar6 + 1;
      iVar2 = iVar2 + iVar5;
    } while (uVar6 != (uint)count);
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}